

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void __thiscall module::listFilesRecursively(module *this,string *basePath,string *filename)

{
  int iVar1;
  dirent *pdVar2;
  char *__s1;
  string path;
  allocator local_111;
  module *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  string *local_100;
  DIR *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_100 = basePath;
  local_f8 = opendir((basePath->_M_dataplus)._M_p);
  if (local_f8 != (DIR *)0x0) {
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    local_108 = &this->sepd;
    local_110 = this;
    while( true ) {
      pdVar2 = readdir(local_f8);
      if (pdVar2 == (dirent *)0x0) break;
      if ((pdVar2->d_name[0] != '.') ||
         ((pdVar2->d_name[1] != '\0' && ((pdVar2->d_name[1] != '.' || (pdVar2->d_name[2] != '\0'))))
         )) {
        __s1 = pdVar2->d_name;
        iVar1 = strcmp(__s1,(filename->_M_dataplus)._M_p);
        if (iVar1 == 0) {
          std::operator+(&local_f0,local_100,local_108);
          std::operator+(&local_90,&local_f0,__s1);
          std::__cxx11::string::operator=((string *)&local_110->module_header,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_f0);
          break;
        }
        std::operator+(&local_f0,local_100,local_108);
        std::__cxx11::string::string((string *)&local_50,__s1,&local_111);
        std::operator+(&local_90,&local_f0,&local_50);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::string((string *)&local_b0,(string *)&local_d0);
        std::__cxx11::string::string((string *)&local_70,(string *)filename);
        listFilesRecursively(local_110,&local_b0,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
    closedir(local_f8);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void module::listFilesRecursively(std::string basePath, std::string filename)
{
    DIR *dir = opendir(basePath.c_str());
    if (!dir)
    {
        return;
    }

    std::string path;
    struct dirent *dp;
    while ((dp = readdir(dir)) != NULL)
    {
        if (strcmp(dp->d_name, ".") != 0 && strcmp(dp->d_name, "..") != 0)
        {
            if (strcmp(dp->d_name, filename.c_str()) == 0)
            {
                module_header = basePath + sepd + dp->d_name;
                break;
            }

            // Construct new path from our base path
            path = basePath + sepd + std::string(dp->d_name);

            listFilesRecursively(path, filename);
        }
    }

    closedir(dir);
}